

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenCard.cpp
# Opt level: O0

void __thiscall GreenCard::GreenCard(GreenCard *this,string *n,int t)

{
  string local_40 [36];
  Type local_1c;
  string *psStack_18;
  int t_local;
  string *n_local;
  GreenCard *this_local;
  
  local_1c = t;
  psStack_18 = n;
  n_local = (string *)this;
  std::__cxx11::string::string(local_40,(string *)n);
  Card::Card(&this->super_Card,(string *)local_40,local_1c);
  std::__cxx11::string::~string(local_40);
  (this->super_Card)._vptr_Card = (_func_int **)&PTR_effectBonus_0012b160;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->cardText);
  std::__cxx11::string::operator=((string *)&this->name,(string *)n);
  this->type = local_1c;
  this->tapped = false;
  return;
}

Assistant:

GreenCard::GreenCard(string n, int t) : Card{n, t}
{
    name = n;
    type = Type(t);

    tapped = false;
}